

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuadaptor_p.cpp
# Opt level: O0

void QDBusMenuAdaptor::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  uint uVar2;
  QString *name;
  QMetaType QVar3;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QDBusMenuAdaptor *in_RDI;
  long in_FS_OFFSET;
  void *_v;
  uint _r_4;
  bool _r;
  QDBusMenuAdaptor *_t;
  QDBusMenuItemList _r_3;
  QList<int> _r_2;
  QList<int> _r_1;
  QDBusVariant _r_5;
  uint in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  QDBusMenuAdaptor *in_stack_fffffffffffffe90;
  QDBusMenuAdaptor *in_stack_fffffffffffffea0;
  uint *puVar4;
  code *in_stack_fffffffffffffea8;
  QDBusMenuEventList *in_stack_fffffffffffffeb0;
  QDBusMenuAdaptor *in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffedc;
  QMetaType local_c8;
  QMetaTypeInterface *local_c0;
  QMetaType local_b8;
  QMetaTypeInterface *local_b0;
  QMetaType local_a8;
  QMetaTypeInterface *local_a0;
  QMetaType local_98;
  QMetaTypeInterface *local_90;
  QMetaTypeInterface *local_88;
  QMetaType local_80;
  QMetaType local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    name = (QString *)(ulong)in_EDX;
    switch(name) {
    case (QString *)0x0:
      ItemActivationRequested
                ((QDBusMenuAdaptor *)0xae95dc,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
      break;
    case (QString *)0x1:
      ItemsPropertiesUpdated
                (in_stack_fffffffffffffe90,
                 (QDBusMenuItemList *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (QDBusMenuItemKeysList *)0xae95fd);
      break;
    case (QString *)0x2:
      LayoutUpdated((QDBusMenuAdaptor *)0xae9622,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88
                   );
      break;
    case (QString *)0x3:
      bVar1 = AboutToShow(in_stack_fffffffffffffea0,0);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(long *)in_RCX = bVar1;
      }
      break;
    case (QString *)0x4:
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      AboutToShowGroup(in_stack_fffffffffffffeb8,(QList<int> *)in_stack_fffffffffffffeb0,
                       (QList<int> *)in_stack_fffffffffffffea8);
      if (*(long *)in_RCX != 0) {
        QList<int>::operator=
                  ((QList<int> *)in_stack_fffffffffffffe90,
                   (QList<int> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      QList<int>::~QList((QList<int> *)0xae96e1);
      break;
    case (QString *)0x5:
      Event(in_RDI,0,(QString *)in_RCX,(QDBusVariant *)in_RDI,in_stack_fffffffffffffedc);
      break;
    case (QString *)0x6:
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      EventGroup(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      if (*(long *)in_RCX != 0) {
        QList<int>::operator=
                  ((QList<int> *)in_stack_fffffffffffffe90,
                   (QList<int> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      QList<int>::~QList((QList<int> *)0xae9793);
      break;
    case (QString *)0x7:
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      GetGroupProperties(in_stack_fffffffffffffea0,(QList<int> *)name,
                         (QStringList *)in_stack_fffffffffffffe90);
      if (*(long *)in_RCX != 0) {
        QList<QDBusMenuItem>::operator=
                  ((QList<QDBusMenuItem> *)in_stack_fffffffffffffe90,
                   (QList<QDBusMenuItem> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      QList<QDBusMenuItem>::~QList((QList<QDBusMenuItem> *)0xae9816);
      break;
    case (QString *)0x8:
      uVar2 = GetLayout(in_stack_fffffffffffffea0,0,in_EDX,(QStringList *)in_stack_fffffffffffffe90,
                        (QDBusMenuLayoutItem *)
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      if (*(long *)in_RCX != 0) {
        **(uint **)in_RCX = uVar2;
      }
      break;
    case (QString *)0x9:
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      GetProperty((QDBusMenuAdaptor *)in_stack_fffffffffffffea8,
                  (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),name);
      if (*(long *)in_RCX != 0) {
        QDBusVariant::operator=
                  ((QDBusVariant *)in_stack_fffffffffffffe90,
                   (QDBusVariant *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      QDBusVariant::~QDBusVariant((QDBusVariant *)0xae98fe);
    }
  }
  if (in_ESI == 7) {
    in_stack_fffffffffffffe90 = (QDBusMenuAdaptor *)(ulong)(in_EDX - 1);
    switch(in_stack_fffffffffffffe90) {
    case (QDBusMenuAdaptor *)0x0:
      in_stack_fffffffffffffe8c = *(uint *)*(char16_t **)(in_RCX + 8);
      if (in_stack_fffffffffffffe8c == 0) {
        local_90 = (QMetaTypeInterface *)QMetaType::fromType<QList<QDBusMenuItem>>();
        **(undefined8 **)in_RCX = local_90;
      }
      else if (in_stack_fffffffffffffe8c == 1) {
        local_88 = (QMetaTypeInterface *)QMetaType::fromType<QList<QDBusMenuItemKeys>>();
        **(undefined8 **)in_RCX = local_88;
      }
      else {
        memset(&local_80,0,8);
        QMetaType::QMetaType(&local_80);
        **(undefined8 **)in_RCX = local_80.d_ptr;
      }
      break;
    default:
      memset(&local_78,0,8);
      QMetaType::QMetaType(&local_78);
      **(undefined8 **)in_RCX = local_78.d_ptr;
      break;
    case (QDBusMenuAdaptor *)0x3:
      if (*(int *)*(char16_t **)(in_RCX + 8) == 0) {
        local_a0 = (QMetaTypeInterface *)QMetaType::fromType<QList<int>>();
        **(undefined8 **)in_RCX = local_a0;
      }
      else {
        memset(&local_98,0,8);
        QMetaType::QMetaType(&local_98);
        **(undefined8 **)in_RCX = local_98.d_ptr;
      }
      break;
    case (QDBusMenuAdaptor *)0x4:
      if (*(int *)*(char16_t **)(in_RCX + 8) == 2) {
        local_b0 = (QMetaTypeInterface *)QMetaType::fromType<QDBusVariant>();
        **(undefined8 **)in_RCX = local_b0;
      }
      else {
        memset(&local_a8,0,8);
        QMetaType::QMetaType(&local_a8);
        **(undefined8 **)in_RCX = local_a8.d_ptr;
      }
      break;
    case (QDBusMenuAdaptor *)0x5:
      if (*(int *)*(char16_t **)(in_RCX + 8) == 0) {
        local_c0 = (QMetaTypeInterface *)QMetaType::fromType<QList<QDBusMenuEvent>>();
        **(undefined8 **)in_RCX = local_c0;
      }
      else {
        memset(&local_b8,0,8);
        QMetaType::QMetaType(&local_b8);
        **(undefined8 **)in_RCX = local_b8.d_ptr;
      }
      break;
    case (QDBusMenuAdaptor *)0x6:
      if (*(int *)*(char16_t **)(in_RCX + 8) == 0) {
        QVar3 = QMetaType::fromType<QList<int>>();
        **(undefined8 **)in_RCX = QVar3.d_ptr;
      }
      else {
        memset(&local_c8,0,8);
        QMetaType::QMetaType(&local_c8);
        **(undefined8 **)in_RCX = local_c8.d_ptr;
      }
    }
  }
  if (in_ESI == 5) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QDBusMenuAdaptor::*)(int,unsigned_int)>
                      (in_RCX,(void **)ItemActivationRequested,0,0);
    if ((bVar1) ||
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QDBusMenuAdaptor::*)(QList<QDBusMenuItem>const&,QList<QDBusMenuItemKeys>const&)>
                          (in_RCX,(void **)ItemsPropertiesUpdated,0,1), bVar1)) goto LAB_00ae9d1e;
    in_stack_fffffffffffffea8 = LayoutUpdated;
    bVar1 = QtMocHelpers::indexOfMethod<void(QDBusMenuAdaptor::*)(unsigned_int,int)>
                      (in_RCX,(void **)LayoutUpdated,0,2);
    if (bVar1) goto LAB_00ae9d1e;
  }
  if (in_ESI == 1) {
    puVar4 = *(uint **)in_RCX;
    if (in_EDX == 0) {
      status((QDBusMenuAdaptor *)in_stack_fffffffffffffea8);
      QString::operator=((QString *)in_stack_fffffffffffffe90,
                         (QString *)CONCAT44(in_stack_fffffffffffffe8c,in_EDX));
      QString::~QString((QString *)0xae9cd9);
    }
    else if (in_EDX == 1) {
      textDirection((QDBusMenuAdaptor *)in_stack_fffffffffffffea8);
      QString::operator=((QString *)in_stack_fffffffffffffe90,
                         (QString *)CONCAT44(in_stack_fffffffffffffe8c,in_EDX));
      QString::~QString((QString *)0xae9d03);
    }
    else if (in_EDX == 2) {
      uVar2 = version((QDBusMenuAdaptor *)in_RDI);
      *puVar4 = uVar2;
    }
  }
LAB_00ae9d1e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuAdaptor::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusMenuAdaptor *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->ItemActivationRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        case 1: _t->ItemsPropertiesUpdated((*reinterpret_cast< std::add_pointer_t<QDBusMenuItemList>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuItemKeysList>>(_a[2]))); break;
        case 2: _t->LayoutUpdated((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: { bool _r = _t->AboutToShow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 4: { QList<int> _r = _t->AboutToShowGroup((*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<int>&>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QList<int>*>(_a[0]) = std::move(_r); }  break;
        case 5: _t->Event((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QDBusVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[4]))); break;
        case 6: { QList<int> _r = _t->EventGroup((*reinterpret_cast< std::add_pointer_t<QDBusMenuEventList>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QList<int>*>(_a[0]) = std::move(_r); }  break;
        case 7: { QDBusMenuItemList _r = _t->GetGroupProperties((*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusMenuItemList*>(_a[0]) = std::move(_r); }  break;
        case 8: { uint _r = _t->GetLayout((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuLayoutItem&>>(_a[4])));
            if (_a[0]) *reinterpret_cast< uint*>(_a[0]) = std::move(_r); }  break;
        case 9: { QDBusVariant _r = _t->GetProperty((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemKeysList >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemList >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusVariant >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuEventList >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(int , uint )>(_a, &QDBusMenuAdaptor::ItemActivationRequested, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(const QDBusMenuItemList & , const QDBusMenuItemKeysList & )>(_a, &QDBusMenuAdaptor::ItemsPropertiesUpdated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(uint , int )>(_a, &QDBusMenuAdaptor::LayoutUpdated, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->status(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->textDirection(); break;
        case 2: *reinterpret_cast<uint*>(_v) = _t->version(); break;
        default: break;
        }
    }
}